

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_attr_set_user(exr_context_t ctxt,int part_index,char *name,char *type,int32_t size,void *out)

{
  exr_const_context_t in_RCX;
  uint8_t **in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  undefined4 in_R8D;
  exr_context_t in_R9;
  exr_attribute_list_t *unaff_retaddr;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  exr_attribute_t *attr;
  exr_attr_opaquedata_t *opq;
  int32_t sz;
  uint in_stack_ffffffffffffffb0;
  exr_context_t ctxt_00;
  exr_attribute_t **in_stack_ffffffffffffffc0;
  exr_attr_opaquedata_t *u;
  undefined4 in_stack_ffffffffffffffd0;
  _internal_exr_context *type_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar1;
  
  ctxt_00 = (exr_context_t)0x0;
  if (in_RDI == (_internal_exr_context *)0x0) {
    eVar1 = 2;
  }
  else {
    type_00 = in_RDI;
    internal_exr_lock(in_RDI);
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      internal_exr_unlock(in_RDI);
      eVar1 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else {
      sz = (int32_t)((ulong)in_RDI->parts[(int)in_ESI] >> 0x20);
      if (in_RDI->mode == '\0') {
        internal_exr_unlock(in_RDI);
        eVar1 = (*in_RDI->standard_error)(in_RDI,8);
      }
      else if (in_RDI->mode == '\x03') {
        internal_exr_unlock(in_RDI);
        eVar1 = (*in_RDI->standard_error)(in_RDI,0x15);
      }
      else {
        eVar1 = exr_attr_list_find_by_name
                          (in_RCX,(exr_attribute_list_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0)
                           ,(char *)in_R9,in_stack_ffffffffffffffc0);
        if (eVar1 == 0xf) {
          if (in_RDI->mode != '\x01') {
            internal_exr_unlock(in_RDI);
            return eVar1;
          }
          eVar1 = exr_attr_list_add_by_type
                            ((exr_context_t)part,unaff_retaddr,
                             (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             (char *)type_00,in_ESI,in_RDX,(exr_attribute_t **)attr);
        }
        else {
          if (eVar1 != 0) {
            internal_exr_unlock(in_RDI);
            return eVar1;
          }
          if (*(int *)(ctxt_00 + 0x14) != 0x1d) {
            internal_exr_unlock(in_RDI);
            eVar1 = (*in_RDI->print_error)
                              (in_RDI,0x10,
                               "\'%s\' requested type \'%s\', but stored attributes is type \'%s\'",
                               in_RDX,in_RCX,*(undefined8 *)(ctxt_00 + 8));
            return eVar1;
          }
          eVar1 = 0;
        }
        u = *(exr_attr_opaquedata_t **)(ctxt_00 + 0x18);
        if (u->pack_func_ptr ==
            (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr *)0x0) {
          eVar1 = exr_attr_opaquedata_set_packed
                            (ctxt_00,(exr_attr_opaquedata_t *)
                                     CONCAT44(eVar1,in_stack_ffffffffffffffb0),in_RDI,sz);
        }
        else {
          eVar1 = exr_attr_opaquedata_set_unpacked
                            (ctxt_00,(exr_attr_opaquedata_t *)
                                     CONCAT44(eVar1,in_stack_ffffffffffffffb0),in_RDI,sz);
          if (eVar1 == 0) {
            eVar1 = exr_attr_opaquedata_pack
                              (in_R9,u,(int32_t *)ctxt_00,(void **)(ulong)in_stack_ffffffffffffffb0)
            ;
          }
        }
        internal_exr_unlock(in_RDI);
      }
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_set_user (
    exr_context_t ctxt,
    int           part_index,
    const char*   name,
    const char*   type,
    int32_t       size,
    const void*   out)
{
    exr_attr_opaquedata_t* opq;
    exr_attribute_t*       attr = NULL;
    exr_result_t           rv   = EXR_ERR_SUCCESS;
    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);
    if (pctxt->mode == EXR_CONTEXT_READ)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));
    if (pctxt->mode == EXR_CONTEXT_WRITING_DATA)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_ALREADY_WROTE_ATTRS));
    rv = exr_attr_list_find_by_name (
        ctxt, (exr_attribute_list_t*) &(part->attributes), name, &attr);
    if (rv == EXR_ERR_NO_ATTR_BY_NAME)
    {
        if (pctxt->mode != EXR_CONTEXT_WRITE)
            return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
        rv = exr_attr_list_add_by_type (
            ctxt, &(part->attributes), name, type, 0, NULL, &(attr));
    }
    else if (rv == EXR_ERR_SUCCESS)
    {
        if (attr->type != EXR_ATTR_OPAQUE)
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_ATTR_TYPE_MISMATCH,
                "'%s' requested type '%s', but stored attributes is type '%s'",
                name,
                type,
                attr->type_name));
    }
    else
        return EXR_UNLOCK_AND_RETURN_PCTXT (rv);

    opq = attr->opaque;
    if (opq->pack_func_ptr)
    {
        rv = exr_attr_opaquedata_set_unpacked (
            ctxt, attr->opaque, EXR_CONST_CAST (void*, out), size);
        if (rv == EXR_ERR_SUCCESS)
            rv = exr_attr_opaquedata_pack (ctxt, attr->opaque, NULL, NULL);
    }
    else
        rv = exr_attr_opaquedata_set_packed (ctxt, attr->opaque, out, size);
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}